

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O2

int __thiscall Imf_2_5::Zip::compress(Zip *this,char *raw,int rawSize,char *compressed)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  BaseExc *this_00;
  char cVar4;
  char *pcVar5;
  long lVar6;
  double dVar7;
  uLongf outSize;
  
  pcVar5 = this->_tmpBuffer;
  lVar6 = (long)rawSize;
  pcVar1 = raw + lVar6;
  for (; raw < pcVar1; raw = raw + 2) {
    *pcVar5 = *raw;
    if (pcVar1 <= raw + 1) break;
    pcVar5[(rawSize + 1) / 2] = raw[1];
    pcVar5 = pcVar5 + 1;
  }
  pcVar5 = this->_tmpBuffer;
  pcVar1 = pcVar5 + lVar6;
  cVar4 = *pcVar5;
  while (pcVar5 = pcVar5 + 1, pcVar5 < pcVar1) {
    cVar2 = *pcVar5;
    *pcVar5 = (cVar2 - cVar4) + -0x80;
    cVar4 = cVar2;
  }
  dVar7 = ceil((double)rawSize * 1.01);
  outSize = (uLongf)((int)dVar7 + 100);
  iVar3 = ::compress(compressed,&outSize,this->_tmpBuffer,lVar6);
  if (iVar3 == 0) {
    return (int)outSize;
  }
  this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::BaseExc::BaseExc(this_00,"Data compression (zlib) failed.");
  __cxa_throw(this_00,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
}

Assistant:

int
Zip::compress(const char *raw, int rawSize, char *compressed)
{
    //
    // Reorder the pixel data.
    //

    {
        char *t1 = _tmpBuffer;
        char *t2 = _tmpBuffer + (rawSize + 1) / 2;
        const char *stop = raw + rawSize;

        while (true)
        {
            if (raw < stop)
            *(t1++) = *(raw++);
            else
            break;

            if (raw < stop)
            *(t2++) = *(raw++);
            else
            break;
        }
    }

    //
    // Predictor.
    //

    {
        unsigned char *t    = (unsigned char *) _tmpBuffer + 1;
        unsigned char *stop = (unsigned char *) _tmpBuffer + rawSize;
        int p = t[-1];

        while (t < stop)
        {
            int d = int (t[0]) - p + (128 + 256);
            p = t[0];
            t[0] = d;
            ++t;
        }
    }

    //
    // Compress the data using zlib
    //

    uLongf outSize = int(ceil(rawSize * 1.01)) + 100;

    if (Z_OK != ::compress ((Bytef *)compressed, &outSize,
                (const Bytef *) _tmpBuffer, rawSize))
    {
        throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
    }

    return outSize;
}